

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write(basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *this,int __fd,void *__buf,size_t __n)

{
  iterator begin;
  type pwVar1;
  undefined4 in_register_00000034;
  type *it;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_ffffffffffffffd0;
  type local_28;
  type *local_20;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *local_18;
  basic_string_view<char> local_10;
  
  local_10.data_ = (char *)CONCAT44(in_register_00000034,__fd);
  local_18 = this;
  local_10.size_ = (size_t)__buf;
  basic_string_view<char>::size(&local_10);
  local_28 = reserve(in_stack_ffffffffffffffd0,(size_t)this);
  local_20 = &local_28;
  begin = basic_string_view<char>::begin(&local_10);
  basic_string_view<char>::end(&local_10);
  pwVar1 = internal::copy_str<wchar_t,char_const*,wchar_t*>(begin,(char *)this,(wchar_t *)0x1675cf);
  *local_20 = pwVar1;
  return (ssize_t)local_20;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }